

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

void jsonenc_putbytes(jsonenc *e,void *data,size_t len)

{
  char *__dest;
  ulong __n;
  
  __dest = e->ptr;
  __n = (long)e->end - (long)__dest;
  if (len < __n || len - __n == 0) {
    memcpy(__dest,data,len);
    e->ptr = e->ptr + len;
  }
  else {
    if (e->end != __dest) {
      memcpy(__dest,data,__n);
      e->ptr = e->ptr + __n;
    }
    e->overflow = e->overflow + (len - __n);
  }
  return;
}

Assistant:

static void jsonenc_putbytes(jsonenc* e, const void* data, size_t len) {
  size_t have = e->end - e->ptr;
  if (UPB_LIKELY(have >= len)) {
    memcpy(e->ptr, data, len);
    e->ptr += len;
  } else {
    if (have) {
      memcpy(e->ptr, data, have);
      e->ptr += have;
    }
    e->overflow += (len - have);
  }
}